

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_gainer_process_pcm_frames
                    (ma_gainer *pGainer,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint channels;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ma_uint64 mVar11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float pRunningGain [32];
  float pRunningGainDelta [32];
  
  if (pGainer == (ma_gainer *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar3 = (pGainer->config).smoothTimeInFrames;
  uVar17 = (ulong)uVar3;
  uVar16 = pGainer->t;
  uVar8 = (ulong)uVar16;
  uVar7 = (ulong)(uVar16 - uVar3);
  if (frameCount <= uVar16 - uVar3) {
    uVar7 = frameCount;
  }
  if (uVar7 == 0 || uVar3 <= uVar16) goto LAB_0015a3cf;
  if (pFramesIn != (void *)0x0 && pFramesOut != (void *)0x0) {
    fVar18 = (float)uVar16 / (float)uVar17;
    fVar19 = 1.0 / (float)uVar17;
    uVar16 = (pGainer->config).channels;
    uVar9 = (ulong)uVar16;
    if (uVar9 < 0x21) {
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        fVar21 = pGainer->pOldGains[uVar10];
        fVar22 = pGainer->masterVolume;
        fVar23 = (pGainer->pNewGains[uVar10] - fVar21) * fVar22;
        pRunningGainDelta[uVar10] = fVar19 * fVar23;
        pRunningGain[uVar10] = fVar21 * fVar22 + fVar23 * fVar18;
      }
      if (uVar9 == 2) {
        uVar10 = 0;
        fVar19 = pRunningGain[1];
        fVar18 = pRunningGain[0];
        while( true ) {
          fVar18 = pRunningGainDelta[0] + fVar18;
          pRunningGain[1] = pRunningGainDelta[1] + pRunningGain[1];
          if ((uVar7 * 8 & 0xfffffffffffffff0) == uVar10) break;
          pfVar1 = (float *)((long)pFramesIn + uVar10);
          fVar21 = pfVar1[1];
          fVar22 = pfVar1[2];
          fVar23 = pfVar1[3];
          pfVar2 = (float *)((long)pFramesOut + uVar10);
          *pfVar2 = *pfVar1 * pRunningGain[0];
          pfVar2[1] = fVar21 * fVar19;
          pfVar2[2] = fVar22 * fVar18;
          pfVar2[3] = fVar23 * pRunningGain[1];
          pRunningGain[0] = pRunningGain[0] + pRunningGainDelta[0];
          fVar19 = fVar19 + pRunningGainDelta[1];
          uVar10 = uVar10 + 0x10;
        }
LAB_0015a34e:
        uVar10 = (ulong)((uint)uVar7 & 0xfffffffe);
      }
      else {
        if (uVar16 == 6) {
          lVar12 = 0;
          fVar18 = pRunningGain[4];
          fVar19 = pRunningGain[5];
          fVar21 = pRunningGain[2];
          fVar22 = pRunningGain[3];
          fVar23 = pRunningGain[0];
          fVar20 = pRunningGain[1];
          while( true ) {
            pRunningGain[0] = pRunningGainDelta[0] + pRunningGain[0];
            pRunningGain[1] = pRunningGainDelta[1] + pRunningGain[1];
            if ((uVar7 >> 1) * 0x30 - lVar12 == 0) break;
            pRunningGain[2] = pRunningGain[2] + pRunningGainDelta[2];
            pRunningGain[3] = pRunningGain[3] + pRunningGainDelta[3];
            pRunningGain[4] = pRunningGain[4] + pRunningGainDelta[4];
            pRunningGain[5] = pRunningGain[5] + pRunningGainDelta[5];
            pfVar1 = (float *)((long)pFramesIn + lVar12);
            fVar4 = pfVar1[1];
            fVar5 = pfVar1[2];
            fVar6 = pfVar1[3];
            pfVar2 = (float *)((long)pFramesOut + lVar12);
            *pfVar2 = *pfVar1 * fVar23;
            pfVar2[1] = fVar4 * fVar20;
            pfVar2[2] = fVar5 * fVar21;
            pfVar2[3] = fVar6 * fVar22;
            pfVar1 = (float *)((long)pFramesIn + lVar12 + 0x10);
            fVar4 = pfVar1[1];
            fVar5 = pfVar1[2];
            fVar6 = pfVar1[3];
            pfVar2 = (float *)((long)pFramesOut + lVar12 + 0x10);
            *pfVar2 = *pfVar1 * fVar18;
            pfVar2[1] = fVar4 * fVar19;
            pfVar2[2] = fVar5 * pRunningGain[0];
            pfVar2[3] = fVar6 * pRunningGain[1];
            pfVar1 = (float *)((long)pFramesIn + lVar12 + 0x20);
            fVar4 = pfVar1[1];
            fVar5 = pfVar1[2];
            fVar6 = pfVar1[3];
            pfVar2 = (float *)((long)pFramesOut + lVar12 + 0x20);
            *pfVar2 = *pfVar1 * pRunningGain[2];
            pfVar2[1] = fVar4 * pRunningGain[3];
            pfVar2[2] = fVar5 * pRunningGain[4];
            pfVar2[3] = fVar6 * pRunningGain[5];
            fVar23 = fVar23 + pRunningGainDelta[0];
            fVar20 = fVar20 + pRunningGainDelta[1];
            fVar21 = fVar21 + pRunningGainDelta[2];
            fVar22 = fVar22 + pRunningGainDelta[3];
            fVar18 = fVar18 + pRunningGainDelta[4];
            fVar19 = fVar19 + pRunningGainDelta[5];
            lVar12 = lVar12 + 0x30;
          }
          goto LAB_0015a34e;
        }
        if (uVar16 == 8) {
          for (lVar12 = 0; uVar10 = uVar7, uVar7 << 5 != lVar12; lVar12 = lVar12 + 0x20) {
            pfVar1 = (float *)((long)pFramesIn + lVar12);
            fVar18 = pfVar1[1];
            fVar19 = pfVar1[2];
            fVar21 = pfVar1[3];
            pfVar2 = (float *)((long)pFramesOut + lVar12);
            *pfVar2 = *pfVar1 * pRunningGain[0];
            pfVar2[1] = fVar18 * pRunningGain[1];
            pfVar2[2] = fVar19 * pRunningGain[2];
            pfVar2[3] = fVar21 * pRunningGain[3];
            pfVar1 = (float *)((long)pFramesIn + lVar12 + 0x10);
            fVar18 = pfVar1[1];
            fVar19 = pfVar1[2];
            fVar21 = pfVar1[3];
            pfVar2 = (float *)((long)pFramesOut + lVar12 + 0x10);
            *pfVar2 = *pfVar1 * pRunningGain[4];
            pfVar2[1] = fVar18 * pRunningGain[5];
            pfVar2[2] = fVar19 * pRunningGain[6];
            pfVar2[3] = fVar21 * pRunningGain[7];
            pRunningGain[0] = pRunningGain[0] + pRunningGainDelta[0];
            pRunningGain[1] = pRunningGain[1] + pRunningGainDelta[1];
            pRunningGain[2] = pRunningGain[2] + pRunningGainDelta[2];
            pRunningGain[3] = pRunningGain[3] + pRunningGainDelta[3];
            pRunningGain[4] = pRunningGain[4] + pRunningGainDelta[4];
            pRunningGain[5] = pRunningGain[5] + pRunningGainDelta[5];
            pRunningGain[6] = pRunningGain[6] + pRunningGainDelta[6];
            pRunningGain[7] = pRunningGain[7] + pRunningGainDelta[7];
          }
        }
        else {
          uVar10 = 0;
        }
      }
      pvVar13 = (void *)((long)pFramesOut + uVar10 * uVar9 * 4);
      pvVar14 = (void *)((long)pFramesIn + uVar10 * uVar9 * 4);
      for (; uVar10 < uVar7; uVar10 = uVar10 + 1) {
        for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
          fVar18 = pRunningGain[uVar15];
          *(float *)((long)pvVar13 + uVar15 * 4) = *(float *)((long)pvVar14 + uVar15 * 4) * fVar18;
          pRunningGain[uVar15] = fVar18 + pRunningGainDelta[uVar15];
        }
        pvVar13 = (void *)((long)pvVar13 + uVar9 * 4);
        pvVar14 = (void *)((long)pvVar14 + uVar9 * 4);
      }
    }
    else {
      pvVar13 = pFramesIn;
      pvVar14 = pFramesOut;
      for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        pfVar1 = pGainer->pOldGains;
        pfVar2 = pGainer->pNewGains;
        fVar21 = pGainer->masterVolume;
        for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)((long)pvVar14 + uVar15 * 4) =
               ((pfVar2[uVar15] - pfVar1[uVar15]) * fVar18 + pfVar1[uVar15]) *
               *(float *)((long)pvVar13 + uVar15 * 4) * fVar21;
        }
        fVar18 = fVar18 + fVar19;
        pvVar14 = (void *)((long)pvVar14 + uVar9 * 4);
        pvVar13 = (void *)((long)pvVar13 + uVar9 * 4);
      }
    }
  }
  uVar16 = (uint)(uVar8 + uVar7);
  if (uVar17 <= uVar8 + uVar7) {
    uVar16 = uVar3;
  }
  pGainer->t = uVar16;
  frameCount = frameCount - uVar7;
  pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
  pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
LAB_0015a3cf:
  if ((float *)pFramesIn != (float *)0x0 && (float *)pFramesOut != (float *)0x0) {
    channels = (pGainer->config).channels;
    uVar7 = (ulong)channels;
    if (uVar7 < 0x21) {
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pRunningGain[uVar8] = pGainer->pNewGains[uVar8] * pGainer->masterVolume;
      }
      ma_copy_and_apply_volume_factor_per_channel_f32
                ((float *)pFramesOut,(float *)pFramesIn,frameCount,channels,pRunningGain);
    }
    else {
      for (mVar11 = 0; mVar11 != frameCount; mVar11 = mVar11 + 1) {
        pfVar1 = pGainer->pNewGains;
        fVar18 = pGainer->masterVolume;
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pFramesOut + uVar8 * 4) =
               *(float *)((long)pFramesIn + uVar8 * 4) * pfVar1[uVar8] * fVar18;
        }
        pFramesOut = (void *)((long)pFramesOut + uVar7 * 4);
        pFramesIn = (void *)((long)pFramesIn + uVar7 * 4);
      }
    }
  }
  if (uVar16 == 0xffffffff) {
    uVar16 = (uint)frameCount;
    if (uVar17 < frameCount) {
      uVar16 = uVar3;
    }
    pGainer->t = uVar16;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_gainer_process_pcm_frames(ma_gainer* pGainer, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    ma_gainer_process_pcm_frames_internal() marks pFramesOut and pFramesIn with MA_RESTRICT which
    helps with auto-vectorization.
    */
    return ma_gainer_process_pcm_frames_internal(pGainer, pFramesOut, pFramesIn, frameCount);
}